

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentPOMDP.cpp
# Opt level: O0

void __thiscall
AgentPOMDP::AgentPOMDP
          (AgentPOMDP *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,
          QAV<PerseusPOMDPPlanner> *QPOMDP)

{
  int iVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  undefined4 extraout_var;
  _func_int **in_RCX;
  AgentDecPOMDPDiscrete *in_RDI;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffffc8;
  AgentSharedObservations *in_stack_ffffffffffffffd0;
  
  AgentSharedObservations::AgentSharedObservations
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(Index)((ulong)in_RDI >> 0x20));
  (in_RDI->super_SimulationAgent)._vptr_SimulationAgent = (_func_int **)&PTR__AgentPOMDP_00d0d878;
  in_RDI[1].super_SimulationAgent._vptr_SimulationAgent = in_RCX;
  in_RDI[1].super_SimulationAgent._m_id = 0;
  in_RDI[1].super_SimulationAgent._m_verbose = false;
  *(undefined3 *)&in_RDI[1].super_SimulationAgent.field_0xd = 0;
  pPVar2 = AgentDecPOMDPDiscrete::GetPU(in_RDI);
  iVar1 = (*(pPVar2->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[10])();
  in_RDI[1]._m_pu = (PlanningUnitDecPOMDPDiscrete *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

AgentPOMDP::AgentPOMDP(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                       QAV<PerseusPOMDPPlanner> *QPOMDP) :
    AgentSharedObservations(pu,id),
    _m_QPOMDP(QPOMDP),
    _m_t(0)
{
    _m_jb=GetPU()->GetNewJointBeliefInterface();
}